

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

void wpe_loader_set_impl_library_name(char *impl_library_name)

{
  size_t sVar1;
  char *__dest;
  ulong __size;
  
  if (impl_library_name != (char *)0x0) {
    sVar1 = strlen(impl_library_name);
    if (sVar1 != 0) {
      __size = sVar1 + 1;
      if (__size < 0x201) {
        __dest = s_impl_library_name_buffer;
      }
      else {
        __dest = (char *)malloc(__size);
        if (__dest == (char *)0x0) {
          wpe_alloc_fail("/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/loader.c"
                         ,0x3a,__size);
        }
      }
      s_impl_library_name = __dest;
      memcpy(__dest,impl_library_name,__size);
      return;
    }
  }
  return;
}

Assistant:

static void
wpe_loader_set_impl_library_name(const char* impl_library_name)
{
    size_t len;

    if (!impl_library_name)
        return;

    len = strlen(impl_library_name) + 1;
    if (len == 1)
        return;

    if (len > IMPL_LIBRARY_NAME_BUFFER_SIZE)
        s_impl_library_name = wpe_malloc(len);
    else
        s_impl_library_name = s_impl_library_name_buffer;
    memcpy(s_impl_library_name, impl_library_name, len);
}